

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Dfs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  Gia_Man_t *pGVar6;
  char *pcVar7;
  char *pcVar8;
  
  bVar2 = false;
  Extra_UtilGetoptReset();
  iVar4 = Extra_UtilGetopt(argc,argv,"nrvh");
  if (iVar4 == -1) {
    if (pAbc->pGia != (Gia_Man_t *)0x0) {
      pGVar6 = Gia_ManDupOrderDfs(pAbc->pGia);
      goto LAB_00279803;
    }
LAB_00279713:
    pcVar8 = "Abc_CommandAbc9Dfs(): There is no AIG.\n";
    iVar4 = -1;
LAB_002797ba:
    Abc_Print(iVar4,pcVar8);
    return 1;
  }
  bVar3 = false;
  bVar1 = false;
  do {
    uVar5 = iVar4 - 0x68U >> 1 | (uint)((iVar4 - 0x68U & 1) != 0) << 0x1f;
    if (uVar5 == 7) {
      bVar2 = (bool)(bVar2 ^ 1);
    }
    else if (uVar5 == 5) {
      bVar3 = (bool)(bVar3 ^ 1);
    }
    else {
      if (uVar5 != 3) {
        Abc_Print(-2,"usage: &dfs [-nrvh]\n");
        Abc_Print(-2,"\t        orders objects in the DFS order\n");
        pcVar7 = "yes";
        pcVar8 = "yes";
        if (!bVar1) {
          pcVar8 = "no";
        }
        Abc_Print(-2,"\t-n    : toggle using normalized ordering [default = %s]\n",pcVar8);
        pcVar8 = "yes";
        if (!bVar3) {
          pcVar8 = "no";
        }
        Abc_Print(-2,"\t-r    : toggle using reverse DFS ordering [default = %s]\n",pcVar8);
        if (!bVar2) {
          pcVar7 = "no";
        }
        Abc_Print(-2,"\t-v    : toggle printing verbose information [default = %s]\n",pcVar7);
        pcVar8 = "\t-h    : print the command usage\n";
        iVar4 = -2;
        goto LAB_002797ba;
      }
      bVar1 = (bool)(bVar1 ^ 1);
    }
    iVar4 = Extra_UtilGetopt(argc,argv,"nrvh");
  } while (iVar4 != -1);
  pGVar6 = pAbc->pGia;
  if (pGVar6 == (Gia_Man_t *)0x0) goto LAB_00279713;
  if (bVar1) {
    pGVar6 = Gia_ManDupOrderAiger(pGVar6);
    if (!bVar2) goto LAB_00279803;
    pcVar8 = "AIG objects are reordered as follows: CIs, ANDs, COs.\n";
  }
  else if (bVar3) {
    pGVar6 = Gia_ManDupOrderDfsReverse(pGVar6);
    if (!bVar2) goto LAB_00279803;
    pcVar8 = "AIG objects are reordered in the reserve DFS order.\n";
  }
  else {
    pGVar6 = Gia_ManDupOrderDfs(pGVar6);
    if (!bVar2) goto LAB_00279803;
    pcVar8 = "AIG objects are reordered in the DFS order.\n";
  }
  Abc_Print(-1,pcVar8);
LAB_00279803:
  Abc_FrameUpdateGia(pAbc,pGVar6);
  return 0;
}

Assistant:

int Abc_CommandAbc9Dfs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int c;
    int fNormal  = 0;
    int fReverse = 0;
    int fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "nrvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'n':
            fNormal ^= 1;
            break;
        case 'r':
            fReverse ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Dfs(): There is no AIG.\n" );
        return 1;
    }
    if ( fNormal )
    {
        pTemp = Gia_ManDupOrderAiger( pAbc->pGia );
        if ( fVerbose )
            Abc_Print( -1, "AIG objects are reordered as follows: CIs, ANDs, COs.\n" );
    }
    else if ( fReverse )
    {
        pTemp = Gia_ManDupOrderDfsReverse( pAbc->pGia );
        if ( fVerbose )
            Abc_Print( -1, "AIG objects are reordered in the reserve DFS order.\n" );
    }
    else
    {
        pTemp = Gia_ManDupOrderDfs( pAbc->pGia );
        if ( fVerbose )
            Abc_Print( -1, "AIG objects are reordered in the DFS order.\n" );
    }
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &dfs [-nrvh]\n" );
    Abc_Print( -2, "\t        orders objects in the DFS order\n" );
    Abc_Print( -2, "\t-n    : toggle using normalized ordering [default = %s]\n", fNormal? "yes": "no" );
    Abc_Print( -2, "\t-r    : toggle using reverse DFS ordering [default = %s]\n", fReverse? "yes": "no" );
    Abc_Print( -2, "\t-v    : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}